

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LowerRet(LowererMD *this,Instr *retInstr)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  RegNum RVar4;
  Which WVar5;
  JITTimeFunctionBody *pJVar6;
  AsmJsJITInfo *this_00;
  undefined4 *puVar7;
  Opnd *src;
  IRType local_29;
  IRType regType;
  Which asmType;
  bool needsRetReg;
  RegOpnd *retReg;
  Instr *retInstr_local;
  LowererMD *this_local;
  
  _asmType = (RegOpnd *)0x0;
  bVar2 = true;
  pJVar6 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
  if ((!bVar3) || (bVar3 = Func::IsLoopBody(this->m_func), bVar3)) {
    _asmType = IR::RegOpnd::New(TyInt64,this->m_func);
    RVar4 = LowererMDArch::GetRegReturn(TyInt64);
    IR::RegOpnd::SetReg(_asmType,RVar4);
  }
  else {
    pJVar6 = Func::GetJITFunctionBody(this->m_func);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar6);
    WVar5 = AsmJsJITInfo::GetRetType(this_00);
    local_29 = TyInt32;
    switch(WVar5) {
    case Int64:
      local_29 = TyInt64;
      break;
    case Double:
      local_29 = TyFloat64;
      break;
    case Float:
      local_29 = TyFloat32;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x3dc,"((0))","UNREACHED");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      break;
    case Signed:
      local_29 = TyInt32;
      break;
    case Void:
      bVar2 = false;
      break;
    case Int32x4:
      local_29 = TySimd128I4;
      break;
    case Uint32x4:
      local_29 = TySimd128U4;
      break;
    case Int16x8:
      local_29 = TySimd128I8;
      break;
    case Int8x16:
      local_29 = TySimd128I16;
      break;
    case Uint16x8:
      local_29 = TySimd128U8;
      break;
    case Uint8x16:
      local_29 = TySimd128U16;
      break;
    case Bool32x4:
      local_29 = TySimd128B4;
      break;
    case Bool16x8:
      local_29 = TySimd128B8;
      break;
    case Bool8x16:
      local_29 = TySimd128B16;
      break;
    case Float32x4:
      local_29 = TySimd128F4;
      break;
    case Float64x2:
      local_29 = TySimd128D2;
      break;
    case Int64x2:
      local_29 = TySimd128I2;
    }
    if (bVar2) {
      _asmType = IR::RegOpnd::New(local_29,this->m_func);
      RVar4 = LowererMDArch::GetRegReturnAsmJs(local_29);
      IR::RegOpnd::SetReg(_asmType,RVar4);
    }
  }
  if (bVar2) {
    src = IR::Instr::UnlinkSrc1(retInstr);
    Lowerer::InsertMove(&_asmType->super_Opnd,src,retInstr,true);
    IR::Instr::SetSrc1(retInstr,&_asmType->super_Opnd);
  }
  return retInstr;
}

Assistant:

IR::Instr *
LowererMD::LowerRet(IR::Instr * retInstr)
{
    IR::RegOpnd * retReg = nullptr;
    bool needsRetReg = true;
#ifdef ASMJS_PLAT
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody()) // for loop body ret is the bytecodeoffset
    {
        Js::AsmJsRetType::Which asmType = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetRetType();
        IRType regType = TyInt32;
        switch (asmType)
        {
        case Js::AsmJsRetType::Double:
            regType = TyFloat64;
            break;
        case Js::AsmJsRetType::Float:
            regType = TyFloat32;
            break;
        case Js::AsmJsRetType::Int64:
        {
            regType = TyInt64;
#if LOWER_SPLIT_INT64
            regType = TyInt32;
            {
                IR::Opnd* lowOpnd = nullptr;
                IR::Opnd* highOpnd = nullptr;
                if (retInstr->GetSrc1()->IsRegOpnd())
                {
                    Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(retInstr->GetSrc1()->AsRegOpnd());
                    lowOpnd = srcPair.low;
                    highOpnd = srcPair.high;
                }
                else if (retInstr->GetSrc1()->IsImmediateOpnd())
                {
                    int64 value = retInstr->GetSrc1()->GetImmediateValue(m_func);
                    lowOpnd = IR::IntConstOpnd::New(value & UINT_MAX, regType, m_func);
                    highOpnd = IR::IntConstOpnd::New(value >> 32, regType, m_func);
                }
                else
                {
                    Assert(UNREACHED);
                }
                retInstr->UnlinkSrc1();
                retInstr->SetSrc1(lowOpnd);

                // Mov high bits to edx
                IR::RegOpnd* regEdx = IR::RegOpnd::New(regType, this->m_func);
                regEdx->SetReg(RegEDX);
                Lowerer::InsertMove(regEdx, highOpnd, retInstr);
                retInstr->SetSrc2(regEdx);
            }
#endif
            break;
        }
        case Js::AsmJsRetType::Void:
            needsRetReg = false;
            break;
        case Js::AsmJsRetType::Signed:
            regType = TyInt32;
            break;
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Float32x4:
            regType = TySimd128F4;
            break;
        case Js::AsmJsRetType::Int32x4:
            regType = TySimd128I4;
            break;
        case Js::AsmJsRetType::Float64x2:
            regType = TySimd128D2;
            break;
        case Js::AsmJsRetType::Int64x2:
            regType = TySimd128I2;
            break;
        case Js::AsmJsRetType::Int16x8:
            regType = TySimd128I8;
            break;
        case Js::AsmJsRetType::Int8x16:
            regType = TySimd128I16;
            break;
        case Js::AsmJsRetType::Uint32x4:
            regType = TySimd128U4;
            break;
        case Js::AsmJsRetType::Uint16x8:
            regType = TySimd128U8;
            break;
        case Js::AsmJsRetType::Uint8x16:
            regType = TySimd128U16;
            break;
        case Js::AsmJsRetType::Bool32x4:
            regType = TySimd128B4;
            break;
        case Js::AsmJsRetType::Bool16x8:
            regType = TySimd128B8;
            break;
        case Js::AsmJsRetType::Bool8x16:
            regType = TySimd128B16;
            break;
#endif
        default:
            Assert(UNREACHED);
        }

        if (needsRetReg)
        {
            retReg = IR::RegOpnd::New(regType, m_func);
            retReg->SetReg(lowererMDArch.GetRegReturnAsmJs(regType));
        }
    }
    else
#endif
    {
        retReg = IR::RegOpnd::New(TyMachReg, m_func);
        retReg->SetReg(lowererMDArch.GetRegReturn(TyMachReg));
    }
    if (needsRetReg)
    {
    Lowerer::InsertMove(retReg, retInstr->UnlinkSrc1(), retInstr);
    retInstr->SetSrc1(retReg);
    }
    return retInstr;
}